

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_event_loop.cpp
# Opt level: O0

int main(void)

{
  canceler func;
  timer func_00;
  int iVar1;
  ostream *poVar2;
  ptime *this;
  ptime pVar3;
  exception *e;
  thread p;
  canceler c;
  cancel_handler ch;
  native_type fds_1 [2];
  timer tt;
  sock2 s2;
  sock1 s1;
  native_type fds [2];
  io_service srv;
  ptime *in_stack_fffffffffffffca8;
  ptime *other;
  ptime *in_stack_fffffffffffffcb0;
  callback<void_(const_std::error_code_&)> *in_stack_fffffffffffffcc8;
  cancel_handler in_stack_fffffffffffffcd0;
  _func_void *in_stack_fffffffffffffcd8;
  io_service *in_stack_fffffffffffffce0;
  sock2 *in_stack_fffffffffffffd00;
  callback<void_(const_std::error_code_&)> *in_stack_fffffffffffffd10;
  undefined8 in_stack_fffffffffffffd20;
  undefined8 in_stack_fffffffffffffd28;
  undefined8 in_stack_fffffffffffffd30;
  undefined8 in_stack_fffffffffffffd38;
  longlong local_138;
  int local_130;
  int local_128;
  ptime *ppStack_120;
  ptime *local_118;
  ptime *local_108;
  int local_100;
  ptime *local_f8;
  ptime *ppStack_f0;
  undefined8 local_e8;
  long lStack_e0;
  ptime *local_d0;
  int local_c8;
  longlong local_c0;
  int local_b8;
  longlong local_b0;
  int local_a8;
  undefined1 local_a0 [12];
  undefined1 local_90 [12];
  ptime *local_80;
  callback acStack_78 [8];
  undefined8 local_70;
  undefined4 uStack_68;
  uint uStack_64;
  sock2 local_60;
  sock1 local_48;
  native_type local_30;
  native_type local_2c;
  ptime local_28 [2];
  undefined4 local_4;
  
  local_4 = 0;
  poVar2 = std::operator<<((ostream *)&std::cout,"Testing IO events");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  booster::aio::io_service::io_service((io_service *)local_28);
  pair((native_type *)in_stack_fffffffffffffcd0.srv);
  sock1::sock1(&local_48,local_30,(io_service *)local_28);
  sock2::sock2(&local_60,local_2c,(io_service *)local_28);
  sock1::async_run((sock1 *)in_stack_fffffffffffffd00);
  sock2::async_run(in_stack_fffffffffffffd00);
  booster::aio::io_service::run();
  if ((done & 1U) == 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Fail: ");
    poVar2 = std::operator<<(poVar2,"done");
    poVar2 = std::operator<<(poVar2," at ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,199);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    return_code = 1;
  }
  booster::aio::io_service::reset();
  poVar2 = std::operator<<((ostream *)&std::cout,"Testing timer events");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  local_80 = local_28;
  local_a0 = booster::ptime::now();
  local_90 = local_a0;
  pVar3 = booster::ptime::milliseconds((longlong)in_stack_fffffffffffffcb0);
  local_c0 = pVar3.sec;
  local_b8 = pVar3.nsec;
  local_b0 = local_c0;
  local_a8 = local_b8;
  pVar3 = booster::ptime::operator+(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
  this = (ptime *)pVar3.sec;
  local_c8 = pVar3.nsec;
  local_70._0_4_ = local_c8;
  uStack_68 = 0;
  uStack_64 = uStack_64 & 0xffffff00;
  lStack_e0 = (ulong)uStack_64 << 0x20;
  local_e8 = local_70;
  local_f8 = local_80;
  func_00.t.sec = in_stack_fffffffffffffd28;
  func_00.srv = (io_service *)in_stack_fffffffffffffd20;
  func_00.t._8_8_ = in_stack_fffffffffffffd30;
  func_00.event_id = (int)in_stack_fffffffffffffd38;
  func_00.cancel = (bool)(char)((ulong)in_stack_fffffffffffffd38 >> 0x20);
  func_00._29_3_ = (int3)((ulong)in_stack_fffffffffffffd38 >> 0x28);
  other = local_80;
  ppStack_f0 = this;
  local_d0 = this;
  booster::callback<void_(const_std::error_code_&)>::callback<timer>
            (in_stack_fffffffffffffd10,func_00);
  booster::aio::io_service::set_timer_event(local_28,acStack_78);
  booster::callback<void_(const_std::error_code_&)>::~callback
            ((callback<void_(const_std::error_code_&)> *)0x10794c);
  booster::aio::io_service::run();
  if ((timer_done & 1U) == 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Fail: ");
    poVar2 = std::operator<<(poVar2,"timer_done");
    poVar2 = std::operator<<(poVar2," at ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xcf);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    return_code = 1;
  }
  booster::aio::io_service::reset();
  poVar2 = std::operator<<((ostream *)&std::cout,"Testing IO events cancelation");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  pair((native_type *)in_stack_fffffffffffffcd0.srv);
  iVar1 = local_100;
  local_118 = local_28;
  local_108 = local_118;
  booster::callback<void_(const_std::error_code_&)>::callback<cancel_handler>
            (in_stack_fffffffffffffcc8,in_stack_fffffffffffffcd0);
  booster::aio::io_service::set_io_event((int)local_28,iVar1,(callback *)0x1);
  booster::callback<void_(const_std::error_code_&)>::~callback
            ((callback<void_(const_std::error_code_&)> *)0x107af1);
  local_128 = local_100;
  ppStack_120 = local_28;
  booster::ptime::now();
  booster::ptime::milliseconds((longlong)this);
  pVar3 = booster::ptime::operator+(this,other);
  local_138 = pVar3.sec;
  local_130 = pVar3.nsec;
  func.srv = in_stack_fffffffffffffce0;
  func._0_8_ = in_stack_fffffffffffffcd8;
  booster::callback<void_(const_std::error_code_&)>::callback<canceler>
            ((callback<void_(const_std::error_code_&)> *)in_stack_fffffffffffffcd0.srv,func);
  booster::aio::io_service::set_timer_event(local_28,(callback *)&local_138);
  booster::callback<void_(const_std::error_code_&)>::~callback
            ((callback<void_(const_std::error_code_&)> *)0x107c74);
  booster::aio::io_service::run();
  if (cancel_called != 1) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Fail: ");
    poVar2 = std::operator<<(poVar2,"cancel_called==1");
    poVar2 = std::operator<<(poVar2," at ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xdb);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    return_code = 1;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"Testing post()");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  if ((post_executed & 1U) == 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Fail: ");
    poVar2 = std::operator<<(poVar2,"post_executed");
    poVar2 = std::operator<<(poVar2," at ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xdd);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    return_code = 1;
  }
  the_service = (io_service *)local_28;
  booster::aio::io_service::reset();
  poVar2 = std::operator<<((ostream *)&std::cout,"Testing adding invalid socket id");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  booster::callback<void(std::error_code_const&)>::callback<void(*)(std::error_code_const&)>
            ((callback<void_(const_std::error_code_&)> *)in_stack_fffffffffffffcd0.srv,
             (_func_void_error_code_ptr *)in_stack_fffffffffffffcc8);
  booster::aio::io_service::set_io_event((int)local_28,-1,(callback *)0x1);
  booster::callback<void_(const_std::error_code_&)>::~callback
            ((callback<void_(const_std::error_code_&)> *)0x107edb);
  got_error_called = false;
  booster::aio::io_service::run();
  if ((got_error_called & 1U) == 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Fail: ");
    poVar2 = std::operator<<(poVar2,"got_error_called");
    poVar2 = std::operator<<(poVar2," at ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xe6);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    return_code = 1;
  }
  booster::aio::io_service::reset();
  poVar2 = std::operator<<((ostream *)&std::cout,"Testing event from other thread");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  post_executed = false;
  std::thread::thread<void(&)(),,void>
            ((thread *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
  booster::aio::io_service::run();
  std::thread::join();
  if ((post_executed & 1U) == 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Fail: ");
    poVar2 = std::operator<<(poVar2,"post_executed");
    poVar2 = std::operator<<(poVar2," at ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xef);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    return_code = 1;
  }
  std::thread::~thread((thread *)0x1080e2);
  booster::aio::io_service::~io_service((io_service *)local_28);
  if (return_code == 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Ok");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  return return_code;
}

Assistant:

int main()
{
	try {
		std::cout << "Testing IO events" << std::endl;
		booster::aio::io_service srv;
		{
			booster::aio::native_type fds[2];
			pair(fds);
			sock1 s1(fds[0],&srv);
			sock2 s2(fds[1],&srv);
			s1.async_run();
			s2.async_run();
			srv.run();
			TEST(done);
		}
		srv.reset();
		{
			std::cout << "Testing timer events" << std::endl;
			timer tt = { &srv, booster::ptime::now() + ptime::milliseconds(100), 0, false };
			srv.set_timer_event(tt.t,tt);
			srv.run();
			TEST(timer_done);
		}
		srv.reset();
		{
			std::cout << "Testing IO events cancelation" << std::endl;
			booster::aio::native_type fds[2];
			pair(fds);
			cancel_handler ch = { &srv };
			srv.set_io_event(fds[0],booster::aio::io_service::in,ch);
			canceler c = { fds[0], &srv };
			srv.set_timer_event(booster::ptime::now() + ptime::milliseconds(100),c);
			srv.run();
			TEST(cancel_called==1);
			std::cout << "Testing post()" << std::endl;
			TEST(post_executed);
		}
		the_service = &srv;
		srv.reset();
		{
			std::cout << "Testing adding invalid socket id" << std::endl;
			srv.set_io_event(booster::aio::invalid_socket,booster::aio::io_service::in,got_error);
			got_error_called = false;
			srv.run();
			TEST(got_error_called);
		}
		srv.reset();
		{
			std::cout << "Testing event from other thread" << std::endl;
			post_executed = false;
			booster::thread p(poster);
			srv.run();
			p.join();
			TEST(post_executed);
		}
	}
	catch(std::exception const &e)
	{
		std::cout<<"Failed:"<< e.what() << std::endl;
		return 1;
	}
	if(return_code == 0)
		std::cout << "Ok" << std::endl;
	return return_code;
}